

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tonk.cpp
# Opt level: O0

Result ValidateTonkSocketConfig(TonkSocketConfig *config)

{
  char *pcVar1;
  long in_RSI;
  ErrorResult *in_RDI;
  ErrorCodeT in_stack_fffffffffffffa80;
  ErrorType in_stack_fffffffffffffa8c;
  string *in_stack_fffffffffffffa90;
  ErrorResult *desc;
  char *in_stack_fffffffffffffa98;
  ErrorResult *in_stack_fffffffffffffaa0;
  ErrorResult *this;
  undefined1 local_3d9 [40];
  allocator local_3b1;
  string local_3b0 [39];
  allocator local_389;
  string local_388 [39];
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [39];
  allocator local_311;
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [39];
  allocator local_299;
  string local_298 [55];
  allocator local_261;
  string local_260 [64];
  undefined8 local_220;
  undefined4 local_214;
  string *local_210;
  char *local_208;
  undefined8 local_1e8;
  undefined4 local_1dc;
  string *local_1d8;
  char *local_1d0;
  undefined8 local_1b0;
  undefined4 local_1a4;
  string *local_1a0;
  char *local_198;
  undefined8 local_178;
  undefined4 local_16c;
  string *local_168;
  char *local_160;
  undefined8 local_140;
  undefined4 local_134;
  string *local_130;
  char *local_128;
  undefined8 local_108;
  undefined4 local_fc;
  string *local_f8;
  char *local_f0;
  undefined8 local_d0;
  undefined4 local_c4;
  string *local_c0;
  char *local_b8;
  undefined8 local_98;
  undefined4 local_8c;
  string *local_88;
  char *local_80;
  undefined8 local_60;
  undefined4 local_54;
  string *local_50;
  char *local_48;
  undefined8 local_28;
  undefined4 local_1c;
  undefined1 *local_18;
  char *local_10;
  
  if (*(uint *)(in_RSI + 0x34) < 30000) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_260,"UDPConnectIntervalUsec < 30 ms invalid",&local_261);
    local_208 = "ValidateTonkSocketConfig";
    local_210 = local_260;
    local_214 = 0;
    local_220 = 1;
    pcVar1 = (char *)operator_new(0x38);
    tonk::ErrorResult::ErrorResult
              (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
               in_stack_fffffffffffffa8c,in_stack_fffffffffffffa80);
    in_RDI->Source = pcVar1;
    std::__cxx11::string::~string(local_260);
    std::allocator<char>::~allocator((allocator<char> *)&local_261);
  }
  else if (*(uint *)(in_RSI + 0x34) < 0xf4241) {
    if (*(uint *)(in_RSI + 0x38) < 1000000) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2c0,"ConnectionTimeoutUsec < 1 second invalid",&local_2c1);
      local_198 = "ValidateTonkSocketConfig";
      local_1a0 = local_2c0;
      local_1a4 = 0;
      local_1b0 = 1;
      pcVar1 = (char *)operator_new(0x38);
      tonk::ErrorResult::ErrorResult
                (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
                 in_stack_fffffffffffffa8c,in_stack_fffffffffffffa80);
      in_RDI->Source = pcVar1;
      std::__cxx11::string::~string(local_2c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
    }
    else if (*(uint *)(in_RSI + 0x38) < 0xaba9501) {
      if ((*(int *)(in_RSI + 0x1c) == 0) || (*(long *)(in_RSI + 0x50) != 0)) {
        if (*(uint *)(in_RSI + 0x1c) < 0x10000) {
          if (*(uint *)(in_RSI + 0x2c) < 5000) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_360,"TimerIntervalMsec < TONK_TIMER_INTERVAL_MIN invalid",&local_361);
            local_b8 = "ValidateTonkSocketConfig";
            local_c0 = local_360;
            local_c4 = 0;
            local_d0 = 1;
            pcVar1 = (char *)operator_new(0x38);
            tonk::ErrorResult::ErrorResult
                      (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90
                       ,in_stack_fffffffffffffa8c,in_stack_fffffffffffffa80);
            in_RDI->Source = pcVar1;
            std::__cxx11::string::~string(local_360);
            std::allocator<char>::~allocator((allocator<char> *)&local_361);
          }
          else if (*(uint *)(in_RSI + 0x2c) < 0x186a1) {
            if (*(uint *)(in_RSI + 0x30) < 2000000) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_3b0,"NoDataTimeoutUsec < TONK_NO_DATA_TIMEOUT_USEC_MIN invalid",
                         &local_3b1);
              local_48 = "ValidateTonkSocketConfig";
              local_50 = local_3b0;
              local_54 = 0;
              local_60 = 1;
              pcVar1 = (char *)operator_new(0x38);
              tonk::ErrorResult::ErrorResult
                        (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
                         in_stack_fffffffffffffa90,in_stack_fffffffffffffa8c,
                         in_stack_fffffffffffffa80);
              in_RDI->Source = pcVar1;
              std::__cxx11::string::~string(local_3b0);
              std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
            }
            else if (*(uint *)(in_RSI + 0x30) < 0x23c34601) {
              tonk::Result::Success();
            }
            else {
              this = (ErrorResult *)local_3d9;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)(local_3d9 + 1),
                         "NoDataTimeoutUsec > TONK_NO_DATA_TIMEOUT_USEC_MAX invalid",
                         (allocator *)this);
              local_10 = "ValidateTonkSocketConfig";
              local_18 = local_3d9 + 1;
              local_1c = 0;
              local_28 = 1;
              desc = in_RDI;
              pcVar1 = (char *)operator_new(0x38);
              tonk::ErrorResult::ErrorResult
                        (this,pcVar1,(string *)desc,in_stack_fffffffffffffa8c,
                         in_stack_fffffffffffffa80);
              desc->Source = pcVar1;
              std::__cxx11::string::~string((string *)(local_3d9 + 1));
              std::allocator<char>::~allocator((allocator<char> *)local_3d9);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_388,"TimerIntervalMsec > TONK_TIMER_INTERVAL_MAX invalid",&local_389);
            local_80 = "ValidateTonkSocketConfig";
            local_88 = local_388;
            local_8c = 0;
            local_98 = 1;
            pcVar1 = (char *)operator_new(0x38);
            tonk::ErrorResult::ErrorResult
                      (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90
                       ,in_stack_fffffffffffffa8c,in_stack_fffffffffffffa80);
            in_RDI->Source = pcVar1;
            std::__cxx11::string::~string(local_388);
            std::allocator<char>::~allocator((allocator<char> *)&local_389);
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_338,"UDPPort invalid",&local_339);
          local_f0 = "ValidateTonkSocketConfig";
          local_f8 = local_338;
          local_fc = 0;
          local_108 = 1;
          pcVar1 = (char *)operator_new(0x38);
          tonk::ErrorResult::ErrorResult
                    (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
                     in_stack_fffffffffffffa8c,in_stack_fffffffffffffa80);
          in_RDI->Source = pcVar1;
          std::__cxx11::string::~string(local_338);
          std::allocator<char>::~allocator((allocator<char> *)&local_339);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_310,"OnIncomingConnection null",&local_311);
        local_128 = "ValidateTonkSocketConfig";
        local_130 = local_310;
        local_134 = 0;
        local_140 = 1;
        pcVar1 = (char *)operator_new(0x38);
        tonk::ErrorResult::ErrorResult
                  (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
                   in_stack_fffffffffffffa8c,in_stack_fffffffffffffa80);
        in_RDI->Source = pcVar1;
        std::__cxx11::string::~string(local_310);
        std::allocator<char>::~allocator((allocator<char> *)&local_311);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2e8,"ConnectionTimeoutUsec > 3 minutes invalid",&local_2e9)
      ;
      local_160 = "ValidateTonkSocketConfig";
      local_168 = local_2e8;
      local_16c = 0;
      local_178 = 1;
      pcVar1 = (char *)operator_new(0x38);
      tonk::ErrorResult::ErrorResult
                (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
                 in_stack_fffffffffffffa8c,in_stack_fffffffffffffa80);
      in_RDI->Source = pcVar1;
      std::__cxx11::string::~string(local_2e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_298,"UDPConnectIntervalUsec > 1 second invalid",&local_299);
    local_1d0 = "ValidateTonkSocketConfig";
    local_1d8 = local_298;
    local_1dc = 0;
    local_1e8 = 1;
    pcVar1 = (char *)operator_new(0x38);
    tonk::ErrorResult::ErrorResult
              (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,
               in_stack_fffffffffffffa8c,in_stack_fffffffffffffa80);
    in_RDI->Source = pcVar1;
    std::__cxx11::string::~string(local_298);
    std::allocator<char>::~allocator((allocator<char> *)&local_299);
  }
  return (Result)in_RDI;
}

Assistant:

static Result ValidateTonkSocketConfig(const TonkSocketConfig* config)
{
    if (config->UDPConnectIntervalUsec < 30 * 1000) {
        return Result("ValidateTonkSocketConfig", "UDPConnectIntervalUsec < 30 ms invalid", ErrorType::Tonk, Tonk_InvalidInput);
    }
    if (config->UDPConnectIntervalUsec > 1000 * 1000) {
        return Result("ValidateTonkSocketConfig", "UDPConnectIntervalUsec > 1 second invalid", ErrorType::Tonk, Tonk_InvalidInput);
    }

    if (config->ConnectionTimeoutUsec < 1000 * 1000) {
        return Result("ValidateTonkSocketConfig", "ConnectionTimeoutUsec < 1 second invalid", ErrorType::Tonk, Tonk_InvalidInput);
    }
    if (config->ConnectionTimeoutUsec > 3 * 60 * 1000 * 1000) {
        return Result("ValidateTonkSocketConfig", "ConnectionTimeoutUsec > 3 minutes invalid", ErrorType::Tonk, Tonk_InvalidInput);
    }

    // OnIncomingConnection is null if no new connections are allowed.
    // OnOutgoingConnection is null if no outgoing connections will be made
    // OnP2PConnectionStart is null if no P2P connections are allowed
    // or if no connection callback is needed.

    // If UDP port is set but incoming connection is not set:
    if (config->UDPListenPort != 0 && !config->OnIncomingConnection) {
        return Result("ValidateTonkSocketConfig", "OnIncomingConnection null", ErrorType::Tonk, Tonk_InvalidInput);
    }

    if (config->UDPListenPort > 65535) {
        return Result("ValidateTonkSocketConfig", "UDPPort invalid", ErrorType::Tonk, Tonk_InvalidInput);
    }

    if (config->TimerIntervalUsec < TONK_TIMER_INTERVAL_MIN) {
        return Result("ValidateTonkSocketConfig", "TimerIntervalMsec < TONK_TIMER_INTERVAL_MIN invalid", ErrorType::Tonk, Tonk_InvalidInput);
    }
    if (config->TimerIntervalUsec > TONK_TIMER_INTERVAL_MAX) {
        return Result("ValidateTonkSocketConfig", "TimerIntervalMsec > TONK_TIMER_INTERVAL_MAX invalid", ErrorType::Tonk, Tonk_InvalidInput);
    }

    if (config->NoDataTimeoutUsec < TONK_NO_DATA_TIMEOUT_USEC_MIN) {
        return Result("ValidateTonkSocketConfig", "NoDataTimeoutUsec < TONK_NO_DATA_TIMEOUT_USEC_MIN invalid", ErrorType::Tonk, Tonk_InvalidInput);
    }
    if (config->NoDataTimeoutUsec > TONK_NO_DATA_TIMEOUT_USEC_MAX) {
        return Result("ValidateTonkSocketConfig", "NoDataTimeoutUsec > TONK_NO_DATA_TIMEOUT_USEC_MAX invalid", ErrorType::Tonk, Tonk_InvalidInput);
    }

    return Result::Success();
}